

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ExpressionTree.cpp
# Opt level: O0

bool anon_unknown.dwarf_e7629::IsLogicalOp(SynBinaryOpType type)

{
  SynBinaryOpType type_local;
  
  return type - SYN_BINARY_OP_LOGICAL_AND < 3;
}

Assistant:

bool IsLogicalOp(SynBinaryOpType type)
	{
		switch(type)
		{
		case SYN_BINARY_OP_LOGICAL_AND:
		case SYN_BINARY_OP_LOGICAL_OR:
		case SYN_BINARY_OP_LOGICAL_XOR:
			return true;
		default:
			break;
		}

		return false;
	}